

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tools_class.cpp
# Opt level: O1

void test_tools::test_nullable_invoker(void)

{
  char *pcVar1;
  size_type sVar2;
  ios_base *this;
  char local_1e0 [32];
  undefined1 local_1c0 [376];
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_nullable",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  test_nullable_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_nullable",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  test_nullable_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_nullable",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  test_nullable_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  this = (ios_base *)(local_1c0 + 0x70);
  std::ios_base::~ios_base(this);
  test_nullable::test_method((test_nullable *)this);
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_nullable",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  test_nullable_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  memset((ostringstream *)local_1c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  local_40 = 0;
  local_38 = '\0';
  local_1e0[0] = '\"';
  local_48 = &local_38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"test_nullable",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  test_nullable_invoker();
  sVar2 = local_40;
  pcVar1 = local_48;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,pcVar1,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_nullable)
{
    tools::nullable_int a, c(815);

    a = 4711;

    int b = a.value();

    BOOST_CHECK_NE(a, 13);
    BOOST_CHECK_EQUAL(a, 4711);
    BOOST_CHECK_EQUAL(b, a);
    BOOST_CHECK_EQUAL(b, 4711);
    BOOST_CHECK_EQUAL(c, 815);
}